

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(ot::commissioner::Timestamp&)>
          (Action<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *this;
  _Head_base<0UL,_ot::commissioner::Timestamp_&,_false> local_70;
  undefined1 local_68 [40];
  undefined1 local_40 [40];
  
  this = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  local_70._M_head_impl =
       (args->super__Tuple_impl<0UL,_ot::commissioner::Timestamp_&>).
       super__Head_base<0UL,_ot::commissioner::Timestamp_&,_false>._M_head_impl;
  Action<ot::commissioner::Error_(ot::commissioner::Timestamp_&)>::Perform
            ((Result *)local_68,action,(ArgumentTuple *)&local_70);
  ot::commissioner::Error::Error((Error *)local_40,(Error *)local_68);
  ActionResultHolder(this,(Wrapper *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_68 + 8));
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }